

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O2

bool __thiscall inja::Parser::parse_expression_datum(Parser *this,Template *tmpl)

{
  string_view *psVar1;
  pointer pBVar2;
  basic_string_view<char,_std::char_traits<char>_> lhs;
  basic_string_view<char,_std::char_traits<char>_> lhs_00;
  basic_string_view<char,_std::char_traits<char>_> lhs_01;
  string_view name;
  string_view name_00;
  bool bVar3;
  Op op;
  const_pointer pcVar4;
  long lVar5;
  uint num_args;
  long lVar6;
  type rhs;
  type rhs_00;
  type rhs_01;
  allocator local_f9;
  basic_string_view<char,_std::char_traits<char>_> *local_f8;
  Template *local_f0;
  Token *local_e8;
  string_view json_text;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  const_pointer local_80;
  string local_78;
  _Any_data local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_e8 = &this->m_tok;
  local_f8 = &(this->m_tok).text;
  local_80 = (const_pointer)0x0;
  lVar6 = 0;
  lVar5 = 0;
  local_f0 = tmpl;
  do {
    switch(local_e8->kind) {
    case Id:
      get_peek_token(this);
      psVar1 = &(this->m_tok).text;
      name_00 = *psVar1;
      name = *psVar1;
      lhs.data_ = psVar1->data_;
      lhs.size_ = psVar1->size_;
      if ((this->m_peek_tok).kind != LeftParen) {
        rhs.size_ = 4;
        rhs.data_ = "true";
        bVar3 = nonstd::sv_lite::operator==(lhs,rhs);
        if (((bVar3) ||
            (lhs_00.data_ = (this->m_tok).text.data_, lhs_00.size_ = (this->m_tok).text.size_,
            rhs_00.size_ = 5, rhs_00.data_ = "false",
            bVar3 = nonstd::sv_lite::operator==(lhs_00,rhs_00), bVar3)) ||
           (lhs_01.data_ = (this->m_tok).text.data_, lhs_01.size_ = (this->m_tok).text.size_,
           rhs_01.size_ = 4, rhs_01.data_ = "null",
           bVar3 = nonstd::sv_lite::operator==(lhs_01,rhs_01), bVar3))
        goto switchD_0018df37_caseD_a;
        local_c0._M_dataplus._M_p._0_1_ = 3;
        json_text.data_ =
             (const_pointer)
             (CONCAT44(json_text.data_._4_4_,(uint)(this->m_config->notation == Pointer)) | 2);
        std::vector<inja::Bytecode,std::allocator<inja::Bytecode>>::
        emplace_back<inja::Bytecode::Op,nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>&,inja::Bytecode::Flag>
                  ((vector<inja::Bytecode,std::allocator<inja::Bytecode>> *)local_f0,(Op *)&local_c0
                   ,local_f8,(Flag *)&json_text);
        goto LAB_0018e216;
      }
      get_next_token(this);
      get_next_token(this);
      num_args = 0;
      if ((this->m_tok).kind == RightParen) goto LAB_0018e4ed;
      local_f8 = (basic_string_view<char,_std::char_traits<char>_> *)CONCAT44(local_f8._4_4_,1);
      do {
        bVar3 = parse_expression(this,local_f0);
        if (!bVar3) {
          std::__cxx11::string::string((string *)&json_text,"parser_error",&local_f9);
          Token::describe_abi_cxx11_(&local_78,local_e8);
          std::operator+(&local_a0,"expected expression, got \'",&local_78);
          std::operator+(&local_c0,&local_a0,"\'");
          inja_throw((string *)&json_text,&local_c0);
          std::__cxx11::string::~string((string *)&local_c0);
          std::__cxx11::string::~string((string *)&local_a0);
          std::__cxx11::string::~string((string *)&local_78);
          std::__cxx11::string::~string((string *)&json_text);
        }
        if (local_e8->kind != Comma) {
          if (local_e8->kind == RightParen) {
            num_args = (uint)local_f8;
LAB_0018e4ed:
            get_next_token(this);
            op = FunctionStorage::find_builtin(&this->m_static->functions,name,num_args);
            if (op != Nop) {
              if (op == Default) {
                pBVar2 = (local_f0->bytecodes).
                         super__Vector_base<inja::Bytecode,_std::allocator<inja::Bytecode>_>._M_impl
                         .super__Vector_impl_data._M_finish;
                std::swap<inja::Bytecode>(pBVar2 + -1,pBVar2 + -2);
              }
              append_function(this,local_f0,op,num_args);
              return true;
            }
            append_callback(this,local_f0,name_00,num_args);
            return true;
          }
          std::__cxx11::string::string((string *)&json_text,"parser_error",&local_f9);
          Token::describe_abi_cxx11_(&local_78,local_e8);
          std::operator+(&local_a0,"expected \')\' or \',\', got \'",&local_78);
          std::operator+(&local_c0,&local_a0,"\'");
          inja_throw((string *)&json_text,&local_c0);
          std::__cxx11::string::~string((string *)&local_c0);
          std::__cxx11::string::~string((string *)&local_a0);
          std::__cxx11::string::~string((string *)&local_78);
          std::__cxx11::string::~string((string *)&json_text);
        }
        get_next_token(this);
        local_f8 = (basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT44(local_f8._4_4_,(uint)local_f8 + 1);
      } while( true );
    case Number:
    case String:
switchD_0018df37_caseD_a:
      if (lVar6 == 0 && lVar5 == 0) {
        pcVar4 = local_f8->data_;
        json_text.data_ = pcVar4;
LAB_0018e18c:
        json_text.size_ = (size_type)(pcVar4 + ((this->m_tok).text.size_ - (long)json_text.data_));
        local_f9 = (allocator)0x3;
        nlohmann::detail::input_adapter::
        input_adapter<nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>,_0>
                  ((input_adapter *)&local_a0,&json_text);
        local_48 = 0;
        uStack_40 = 0;
        local_58._M_unused._M_object = (void *)0x0;
        local_58._8_8_ = 0;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::parse((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)&local_c0,(input_adapter *)&local_a0,(parser_callback_t *)&local_58,true);
        local_78._M_dataplus._M_p._0_4_ = 1;
        std::vector<inja::Bytecode,std::allocator<inja::Bytecode>>::
        emplace_back<inja::Bytecode::Op,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,inja::Bytecode::Flag>
                  ((vector<inja::Bytecode,std::allocator<inja::Bytecode>> *)local_f0,(Op *)&local_f9
                   ,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)&local_c0,(Flag *)&local_78);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       *)&local_c0);
        std::_Function_base::~_Function_base((_Function_base *)&local_58);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_a0._M_string_length);
        goto LAB_0018e216;
      }
      break;
    case Comma:
    case Colon:
      if (lVar6 == 0 && lVar5 == 0) {
        std::__cxx11::string::string((string *)&json_text,"parser_error",&local_f9);
        Token::describe_abi_cxx11_(&local_78,local_e8);
        std::operator+(&local_a0,"unexpected token \'",&local_78);
        std::operator+(&local_c0,&local_a0,"\'");
        inja_throw((string *)&json_text,&local_c0);
        std::__cxx11::string::~string((string *)&local_c0);
        std::__cxx11::string::~string((string *)&local_a0);
        std::__cxx11::string::~string((string *)&local_78);
        std::__cxx11::string::~string((string *)&json_text);
        lVar6 = 0;
        lVar5 = 0;
      }
      break;
    case LeftParen:
      get_next_token(this);
      bVar3 = parse_expression(this,local_f0);
      if (!bVar3) {
        return false;
      }
      if (local_e8->kind != RightParen) {
        std::__cxx11::string::string((string *)&json_text,"parser_error",(allocator *)&local_a0);
        std::__cxx11::string::string((string *)&local_c0,"unmatched \'(\'",(allocator *)&local_78);
        inja_throw((string *)&json_text,&local_c0);
        std::__cxx11::string::~string((string *)&local_c0);
        std::__cxx11::string::~string((string *)&json_text);
      }
LAB_0018e216:
      get_next_token(this);
      return true;
    default:
      if (lVar6 != 0) {
        std::__cxx11::string::string((string *)&json_text,"parser_error",(allocator *)&local_a0);
        std::__cxx11::string::string((string *)&local_c0,"unmatched \'{\'",(allocator *)&local_78);
        inja_throw((string *)&json_text,&local_c0);
        std::__cxx11::string::~string((string *)&local_c0);
        std::__cxx11::string::~string((string *)&json_text);
      }
      if (lVar5 == 0) {
        return false;
      }
      std::__cxx11::string::string((string *)&json_text,"parser_error",(allocator *)&local_a0);
      std::__cxx11::string::string((string *)&local_c0,"unmatched \'[\'",(allocator *)&local_78);
      inja_throw((string *)&json_text,&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&json_text);
      return false;
    case LeftBracket:
      if (lVar6 == 0 && lVar5 == 0) {
        local_80 = local_f8->data_;
      }
      lVar5 = lVar5 + 1;
      break;
    case RightBracket:
      if (lVar5 == 0) {
        std::__cxx11::string::string((string *)&json_text,"parser_error",(allocator *)&local_a0);
        std::__cxx11::string::string((string *)&local_c0,"unexpected \']\'",(allocator *)&local_78);
        inja_throw((string *)&json_text,&local_c0);
        std::__cxx11::string::~string((string *)&local_c0);
        std::__cxx11::string::~string((string *)&json_text);
      }
      lVar5 = lVar5 + -1;
      goto LAB_0018e15a;
    case LeftBrace:
      if (lVar6 == 0 && lVar5 == 0) {
        local_80 = local_f8->data_;
      }
      lVar6 = lVar6 + 1;
      break;
    case RightBrace:
      if (lVar6 == 0) {
        std::__cxx11::string::string((string *)&json_text,"parser_error",(allocator *)&local_a0);
        std::__cxx11::string::string((string *)&local_c0,"unexpected \'}\'",(allocator *)&local_78);
        inja_throw((string *)&json_text,&local_c0);
        std::__cxx11::string::~string((string *)&local_c0);
        std::__cxx11::string::~string((string *)&json_text);
      }
      lVar6 = lVar6 + -1;
LAB_0018e15a:
      if (lVar6 != 0 || lVar5 != 0) break;
      pcVar4 = local_f8->data_;
      json_text.data_ = local_80;
      goto LAB_0018e18c;
    }
    get_next_token(this);
  } while( true );
}

Assistant:

bool parse_expression_datum(Template& tmpl) {
		nonstd::string_view json_first;
		size_t bracket_level = 0;
		size_t brace_level = 0;

		for (;;) {
			switch (m_tok.kind) {
				case Token::Kind::LeftParen: {
					get_next_token();
					if (!parse_expression(tmpl)) return false;
					if (m_tok.kind != Token::Kind::RightParen) {
						inja_throw("parser_error", "unmatched '('");
					}
					get_next_token();
					return true;
				}
				case Token::Kind::Id:
					get_peek_token();
					if (m_peek_tok.kind == Token::Kind::LeftParen) {
						// function call, parse arguments
						Token func_token = m_tok;
						get_next_token();  // id
						get_next_token();  // leftParen
						unsigned int num_args = 0;
						if (m_tok.kind == Token::Kind::RightParen) {
							// no args
							get_next_token();
						} else {
							for (;;) {
								if (!parse_expression(tmpl)) {
									inja_throw("parser_error", "expected expression, got '" + m_tok.describe() + "'");
								}
								num_args += 1;
								if (m_tok.kind == Token::Kind::RightParen) {
									get_next_token();
									break;
								}
								if (m_tok.kind != Token::Kind::Comma) {
									inja_throw("parser_error", "expected ')' or ',', got '" + m_tok.describe() + "'");
								}
								get_next_token();
							}
						}

						auto op = m_static.functions.find_builtin(func_token.text, num_args);

						if (op != Bytecode::Op::Nop) {
							// swap arguments for default(); see comment in RenderTo()
							if (op == Bytecode::Op::Default)
								std::swap(tmpl.bytecodes.back(), *(tmpl.bytecodes.rbegin() + 1));
							append_function(tmpl, op, num_args);
							return true;
						} else {
							append_callback(tmpl, func_token.text, num_args);
							return true;
						}
					} else if (m_tok.text == "true" || m_tok.text == "false" || m_tok.text == "null") {
						// true, false, null are json literals
						if (brace_level == 0 && bracket_level == 0) {
							json_first = m_tok.text;
							goto returnJson;
						}
						break;
					} else {
						// normal literal (json read)
						tmpl.bytecodes.emplace_back(Bytecode::Op::Push, m_tok.text,
													m_config.notation == ElementNotation::Pointer
														? Bytecode::Flag::ValueLookupPointer
														: Bytecode::Flag::ValueLookupDot);
						get_next_token();
						return true;
					}
				// json passthrough
				case Token::Kind::Number:
				case Token::Kind::String:
					if (brace_level == 0 && bracket_level == 0) {
						json_first = m_tok.text;
						goto returnJson;
					}
					break;
				case Token::Kind::Comma:
				case Token::Kind::Colon:
					if (brace_level == 0 && bracket_level == 0) {
						inja_throw("parser_error", "unexpected token '" + m_tok.describe() + "'");
					}
					break;
				case Token::Kind::LeftBracket:
					if (brace_level == 0 && bracket_level == 0) {
						json_first = m_tok.text;
					}
					bracket_level += 1;
					break;
				case Token::Kind::LeftBrace:
					if (brace_level == 0 && bracket_level == 0) {
						json_first = m_tok.text;
					}
					brace_level += 1;
					break;
				case Token::Kind::RightBracket:
					if (bracket_level == 0) {
						inja_throw("parser_error", "unexpected ']'");
					}
					--bracket_level;
					if (brace_level == 0 && bracket_level == 0) goto returnJson;
					break;
				case Token::Kind::RightBrace:
					if (brace_level == 0) {
						inja_throw("parser_error", "unexpected '}'");
					}
					--brace_level;
					if (brace_level == 0 && bracket_level == 0) goto returnJson;
					break;
				default:
					if (brace_level != 0) {
						inja_throw("parser_error", "unmatched '{'");
					}
					if (bracket_level != 0) {
						inja_throw("parser_error", "unmatched '['");
					}
					return false;
			}

			get_next_token();
		}

	returnJson:
		// bridge across all intermediate tokens
		nonstd::string_view json_text(json_first.data(), m_tok.text.data() - json_first.data() + m_tok.text.size());
		tmpl.bytecodes.emplace_back(Bytecode::Op::Push, json::parse(json_text), Bytecode::Flag::ValueImmediate);
		get_next_token();
		return true;
	}